

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

Vector * operator/(Vector *__return_storage_ptr__,Vector *l,double lambda)

{
  double *pdVar1;
  double *now;
  double *pdVar2;
  Vector *r;
  
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,l);
  pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar2 != pdVar1) {
    do {
      *pdVar2 = *pdVar2 * (1.0 / lambda);
      pdVar2 = pdVar2 + 1;
    } while (pdVar2 != pdVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector operator/(const Vector& l, double lambda)
{
	return l * (1 / lambda);
}